

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O3

void topten_level_name(int dnum,int dlev,char *outbuf)

{
  char *__s;
  char *pcVar1;
  char *__format;
  
  if (dungeon_topology.d_astral_level.dnum == dnum) {
    if ((uint)dlev < 0xfffffffb) {
      __format = "on the Plane of %s";
      pcVar1 = "Void";
    }
    else {
      pcVar1 = &DAT_002d5050 + *(int *)(&DAT_002d5064 + (long)dlev * 4);
      __format = &DAT_002d5064 + *(int *)(&DAT_002d5078 + (long)dlev * 4);
    }
    __s = eos(outbuf);
    sprintf(__s,__format,pcVar1);
    return;
  }
  pcVar1 = eos(outbuf);
  sprintf(pcVar1,"in %s",dungeons + dnum);
  if (dungeon_topology.d_knox_level.dnum == dnum) {
    return;
  }
  pcVar1 = eos(outbuf);
  sprintf(pcVar1," on level %d",dlev);
  return;
}

Assistant:

void topten_level_name(int dnum, int dlev, char *outbuf)
{
    if (dnum == astral_level.dnum) {
	const char *arg, *fmt = "on the Plane of %s";

	switch (dlev) {
	case -5:
		fmt = "on the %s Plane";
		arg = "Astral";	break;
	case -4:
		arg = "Water";	break;
	case -3:
		arg = "Fire";	break;
	case -2:
		arg = "Air";	break;
	case -1:
		arg = "Earth";	break;
	default:
		arg = "Void";	break;
	}
	sprintf(eos(outbuf), fmt, arg);
    } else {
	sprintf(eos(outbuf), "in %s", dungeons[dnum].dname);
	if (dnum != knox_level.dnum)
	    sprintf(eos(outbuf), " on level %d", dlev);
    }
}